

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O1

void __thiscall
pbrt::HaltonSampler::HaltonSampler
          (HaltonSampler *this,int samplesPerPixel,Point2i *fullResolution,
          vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_>
          *dp,Allocator alloc)

{
  vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_> *pvVar1;
  
  this->digitPermutations = dp;
  this->samplesPerPixel = samplesPerPixel;
  HaltonPixelIndexer::HaltonPixelIndexer(&this->haltonPixelIndexer,fullResolution);
  (this->pixel).super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)0x7fffffff7fffffff;
  this->sampleIndex = 0;
  this->dimension = 0;
  if (dp == (vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_>
             *)0x0) {
    pvVar1 = ComputeRadicalInversePermutations(0,alloc);
    this->digitPermutations = pvVar1;
  }
  return;
}

Assistant:

HaltonSampler::HaltonSampler(int samplesPerPixel, const Point2i &fullResolution,
                             pstd::vector<DigitPermutation> *dp, Allocator alloc)
    : digitPermutations(dp),
      samplesPerPixel(samplesPerPixel),
      haltonPixelIndexer(fullResolution) {
    // Generate random digit permutations for Halton sampler
    if (!dp)
        digitPermutations = ComputeRadicalInversePermutations(0, alloc);
}